

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool cJSON_PrintPreallocated(cJSON *item,char *buf,int len,cJSON_bool fmt)

{
  undefined1 local_68 [8];
  printbuffer p;
  cJSON_bool fmt_local;
  int len_local;
  char *buf_local;
  cJSON *item_local;
  
  p.hooks.reallocate._0_4_ = fmt;
  p.hooks.reallocate._4_4_ = len;
  memset(local_68,0,0x40);
  if ((p.hooks.reallocate._4_4_ < 0) || (buf == (char *)0x0)) {
    item_local._4_4_ = 0;
  }
  else {
    p.buffer = (uchar *)(long)p.hooks.reallocate._4_4_;
    p.length = 0;
    p.depth._0_4_ = 1;
    p.depth._4_4_ = (cJSON_bool)p.hooks.reallocate;
    p._32_8_ = global_hooks.allocate;
    p.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
    p.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
    local_68 = (undefined1  [8])buf;
    item_local._4_4_ = print_value(item,(printbuffer *)local_68);
  }
  return item_local._4_4_;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_PrintPreallocated(cJSON *item, char *buf, const int len, const cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if ((len < 0) || (buf == NULL))
    {
        return false;
    }

    p.buffer = (unsigned char*)buf;
    p.length = (size_t)len;
    p.offset = 0;
    p.noalloc = true;
    p.format = fmt;
    p.hooks = global_hooks;

    return print_value(item, &p);
}